

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproto.c
# Opt level: O1

int sproto_pack(void *srcv,int srcsz,void *bufferv,int bufsz)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  size_t __n;
  uint uVar10;
  undefined8 *puVar11;
  undefined8 *__src;
  byte bVar12;
  uint uVar13;
  uint8_t tmp [8];
  undefined8 local_48;
  void *local_40;
  ulong local_38;
  
  local_40 = srcv;
  if (srcsz < 1) {
    puVar11 = (undefined8 *)0x0;
    pbVar8 = (byte *)0x0;
    iVar7 = 0;
    iVar3 = 0;
  }
  else {
    uVar1 = (ulong)(uint)srcsz;
    iVar3 = 0;
    iVar7 = 0;
    pbVar8 = (byte *)0x0;
    uVar5 = 0;
    __src = (undefined8 *)0x0;
    do {
      local_38 = uVar5 + 8;
      if (local_38 - uVar1 != 0 && (long)uVar1 <= (long)local_38) {
        iVar4 = (int)uVar5 - srcsz;
        memcpy(&local_48,srcv,8 - (local_38 - uVar1));
        memset((void *)((long)&local_48 + (7 - (ulong)(iVar4 + 7))),0,(ulong)(iVar4 + 8));
        srcv = &local_48;
      }
      pbVar9 = (byte *)((long)bufferv + 1);
      iVar4 = bufsz + -1;
      lVar6 = 0;
      uVar13 = 0;
      bVar12 = 0;
      do {
        if (*(byte *)((long)srcv + lVar6) != 0) {
          uVar13 = uVar13 + 1;
          bVar12 = bVar12 | (byte)(1 << ((byte)lVar6 & 0x1f));
          if (0 < iVar4) {
            *pbVar9 = *(byte *)((long)srcv + lVar6);
            pbVar9 = pbVar9 + 1;
            iVar4 = iVar4 + -1;
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      pbVar9 = (byte *)bufferv;
      if (bufsz < 1) {
        pbVar9 = (byte *)0x0;
      }
      if (uVar13 == 8 || 0 < iVar7 && (uVar13 & 0xfffffffe) == 6) {
        iVar4 = (uint)(iVar7 < 1) * 2 + 8;
      }
      else {
        if (pbVar9 != (byte *)0x0) {
          *pbVar9 = bVar12;
        }
        iVar4 = uVar13 + 1;
      }
      bufsz = bufsz - iVar4;
      puVar11 = (undefined8 *)srcv;
      pbVar9 = (byte *)bufferv;
      iVar2 = 1;
      if (iVar4 != 10) {
        puVar11 = __src;
        pbVar9 = pbVar8;
        if ((iVar7 < 1) || (iVar4 != 8)) {
          iVar2 = iVar7;
          if (0 < iVar7) {
            if (-1 < bufsz) {
              __n = (size_t)(uint)(iVar7 * 8);
              *pbVar8 = 0xff;
              pbVar8[1] = (char)iVar7 - 1;
              goto LAB_00127e13;
            }
LAB_00127e3c:
            iVar2 = 0;
          }
        }
        else {
          iVar2 = iVar7 + 1;
          if (iVar7 + 1 == 0x100) {
            if (bufsz < 0) goto LAB_00127e3c;
            pbVar8[0] = 0xff;
            pbVar8[1] = 0xff;
            __n = 0x800;
LAB_00127e13:
            memcpy(pbVar8 + 2,__src,__n);
            iVar2 = 0;
          }
        }
      }
      iVar7 = iVar2;
      pbVar8 = pbVar9;
      srcv = (void *)((long)srcv + 8);
      bufferv = (void *)((long)bufferv + (long)iVar4);
      iVar3 = iVar3 + iVar4;
      uVar5 = local_38;
      __src = puVar11;
    } while (local_38 < uVar1);
  }
  if (-1 < bufsz) {
    if (iVar7 == 1) {
      pbVar8[0] = 0xff;
      pbVar8[1] = 0;
      *(undefined8 *)(pbVar8 + 2) = *puVar11;
    }
    else if (1 < iVar7) {
      iVar4 = (int)local_40 - (int)puVar11;
      iVar7 = iVar4 + srcsz;
      uVar13 = srcsz + iVar4 + 7;
      uVar10 = uVar13 & 0xfffffff8;
      *pbVar8 = 0xff;
      pbVar8[1] = (char)(uVar13 >> 3) - 1;
      memcpy(pbVar8 + 2,puVar11,(long)iVar7);
      uVar13 = uVar10 - iVar7;
      if (uVar13 != 0 && iVar7 <= (int)uVar10) {
        memset(pbVar8 + (long)iVar7 + 2,0,(ulong)uVar13);
      }
    }
  }
  return iVar3;
}

Assistant:

int
sproto_pack(const void * srcv, int srcsz, void * bufferv, int bufsz) {
	uint8_t tmp[8];
	int i;
	const uint8_t * ff_srcstart = NULL;
	uint8_t * ff_desstart = NULL;
	int ff_n = 0;
	int size = 0;
	const uint8_t * src = srcv;
	uint8_t * buffer = bufferv;
	for (i=0;i<srcsz;i+=8) {
		int n;
		int padding = i+8 - srcsz;
		if (padding > 0) {
			int j;
			memcpy(tmp, src, 8-padding);
			for (j=0;j<padding;j++) {
				tmp[7-j] = 0;
			}
			src = tmp;
		}
		n = pack_seg(src, buffer, bufsz, ff_n);
		bufsz -= n;
		if (n == 10) {
			// first FF
			ff_srcstart = src;
			ff_desstart = buffer;
			ff_n = 1;
		} else if (n==8 && ff_n>0) {
			++ff_n;
			if (ff_n == 256) {
				if (bufsz >= 0) {
					write_ff(ff_srcstart, ff_desstart, 256*8);
				}
				ff_n = 0;
			}
		} else {
			if (ff_n > 0) {
				if (bufsz >= 0) {
					write_ff(ff_srcstart, ff_desstart, ff_n*8);
				}
				ff_n = 0;
			}
		}
		src += 8;
		buffer += n;
		size += n;
	}
	if(bufsz >= 0){
		if(ff_n == 1)
			write_ff(ff_srcstart, ff_desstart, 8);
		else if (ff_n > 1)
			write_ff(ff_srcstart, ff_desstart, srcsz - (intptr_t)(ff_srcstart - (const uint8_t*)srcv));
	}
	return size;
}